

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

void __thiscall gl3cts::PerVertexValidationTest::destroyPOsAndSOs(PerVertexValidationTest *this)

{
  GLuint *pGVar1;
  int *piVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  GLuint *so_id_ptr;
  uint n_so_id;
  GLuint *po_id_ptr;
  uint n_po_id;
  uint n_so_id_ptrs;
  uint n_po_id_ptrs;
  GLuint *so_id_ptrs [5];
  GLuint *local_48;
  GLuint *po_id_ptrs [5];
  Functions *gl;
  PerVertexValidationTest *this_local;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  po_id_ptrs[0] = &this->m_gs_po_id;
  po_id_ptrs[1] = &this->m_tc_po_id;
  po_id_ptrs[2] = &this->m_te_po_id;
  po_id_ptrs[3] = &this->m_vs_po_id;
  _n_so_id_ptrs = &this->m_fs_id;
  so_id_ptrs[0] = &this->m_gs_id;
  so_id_ptrs[1] = &this->m_tc_id;
  so_id_ptrs[2] = &this->m_te_id;
  so_id_ptrs[3] = &this->m_vs_id;
  for (po_id_ptr._4_4_ = 0; po_id_ptr._4_4_ < 5; po_id_ptr._4_4_ = po_id_ptr._4_4_ + 1) {
    pGVar1 = po_id_ptrs[(ulong)po_id_ptr._4_4_ - 1];
    if (*pGVar1 != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x448))(*pGVar1);
      *pGVar1 = 0;
    }
  }
  for (so_id_ptr._4_4_ = 0; so_id_ptr._4_4_ < 5; so_id_ptr._4_4_ = so_id_ptr._4_4_ + 1) {
    piVar2 = *(int **)(&n_so_id_ptrs + (ulong)so_id_ptr._4_4_ * 2);
    if (*piVar2 != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x470))(*piVar2);
      *piVar2 = 0;
    }
  }
  return;
}

Assistant:

void PerVertexValidationTest::destroyPOsAndSOs()
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLuint*		  po_id_ptrs[] = { &m_fs_po_id, &m_gs_po_id, &m_tc_po_id, &m_te_po_id, &m_vs_po_id };
	glw::GLuint*		  so_id_ptrs[] = { &m_fs_id, &m_gs_id, &m_tc_id, &m_te_id, &m_vs_id };
	const unsigned int	n_po_id_ptrs = static_cast<const unsigned int>(sizeof(po_id_ptrs) / sizeof(po_id_ptrs[0]));
	const unsigned int	n_so_id_ptrs = static_cast<const unsigned int>(sizeof(so_id_ptrs) / sizeof(so_id_ptrs[0]));

	for (unsigned int n_po_id = 0; n_po_id < n_po_id_ptrs; ++n_po_id)
	{
		glw::GLuint* po_id_ptr = po_id_ptrs[n_po_id];

		if (*po_id_ptr != 0)
		{
			gl.deleteProgram(*po_id_ptr);

			*po_id_ptr = 0;
		}
	} /* for (all shader program object ids) */

	for (unsigned int n_so_id = 0; n_so_id < n_so_id_ptrs; ++n_so_id)
	{
		glw::GLuint* so_id_ptr = so_id_ptrs[n_so_id];

		if (*so_id_ptr != 0)
		{
			gl.deleteShader(*so_id_ptr);

			*so_id_ptr = 0;
		}
	} /* for (all shader object ids) */
}